

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

void __thiscall CVmObjByteArray::discard_undo(CVmObjByteArray *this,CVmUndoRecord *rec)

{
  if ((rec->id).ptrval != (void *)0x0) {
    free((rec->id).ptrval);
    (rec->id).ptrval = (void *)0x0;
  }
  return;
}

Assistant:

void CVmObjByteArray::discard_undo(VMG_ struct CVmUndoRecord *rec)
{
    /* delete our extra information record if present */
    if (rec->id.ptrval != 0)
    {
        /* free the record */
        t3free((bytearray_undo_rec *)rec->id.ptrval);

        /* clear the pointer so we know it's gone */
        rec->id.ptrval = 0;
    }
}